

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmsnorm_x86.cpp
# Opt level: O2

void ncnn::rmsnorm(float *ptr,float *gamma_ptr,float eps,int elemcount,int elempack)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  bool bVar11;
  bool bVar12;
  int iVar13;
  long lVar14;
  int i;
  int iVar15;
  float *ptr0;
  undefined1 (*pauVar16) [64];
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 in_register_00001204 [60];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar30;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar33 [28];
  float fVar40;
  undefined1 auVar34 [32];
  float fVar41;
  float fVar48;
  float fVar51;
  undefined1 auVar44 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  float fVar47;
  float fVar49;
  float fVar50;
  undefined1 auVar45 [64];
  undefined1 auVar52 [32];
  
  auVar20._4_60_ = in_register_00001204;
  auVar20._0_4_ = eps;
  iVar13 = elempack * elemcount;
  auVar45 = ZEXT1664(ZEXT816(0) << 0x40);
  pauVar16 = (undefined1 (*) [64])ptr;
  for (iVar15 = 0; iVar15 + 0xf < iVar13; iVar15 = iVar15 + 0x10) {
    auVar45 = vfmadd231ps_avx512f(auVar45,*pauVar16,*pauVar16);
    pauVar16 = pauVar16 + 1;
  }
  auVar18 = ZEXT816(0) << 0x40;
  while( true ) {
    auVar33 = ZEXT1628(auVar18);
    if (iVar13 <= iVar15 + 7) break;
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),*(undefined1 (*) [32])*pauVar16,
                              *(undefined1 (*) [32])*pauVar16);
    pauVar16 = (undefined1 (*) [64])(*pauVar16 + 0x20);
    iVar15 = iVar15 + 8;
  }
  auVar27 = ZEXT816(0) << 0x40;
  for (; iVar15 + 3 < iVar13; iVar15 = iVar15 + 4) {
    auVar27 = vfmadd231ps_fma(auVar27,*(undefined1 (*) [16])*pauVar16,
                              *(undefined1 (*) [16])*pauVar16);
    pauVar16 = (undefined1 (*) [64])(*pauVar16 + 0x10);
  }
  auVar26 = ZEXT816(0) << 0x40;
  for (; iVar15 < iVar13; iVar15 = iVar15 + 1) {
    auVar26 = vfmadd231ss_fma(auVar26,ZEXT416(*(uint *)*pauVar16),ZEXT416(*(uint *)*pauVar16));
    pauVar16 = (undefined1 (*) [64])(*pauVar16 + 4);
  }
  if (elempack == 0x10) {
    auVar20 = vbroadcastss_avx512f(auVar20._0_16_);
    auVar21 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / (float)elemcount)));
    auVar45 = vfmadd213ps_avx512f(auVar21,auVar45,auVar20);
    auVar19 = vrsqrtps_avx(auVar45._0_32_);
    auVar20 = ZEXT3264(auVar19);
    auVar19 = vextractf64x4_avx512f(auVar45,1);
    auVar19 = vrsqrtps_avx(auVar19);
    auVar45 = vinsertf64x4_avx512f(auVar20,auVar19,1);
    if (gamma_ptr == (float *)0x0) {
LAB_0052ef1c:
      for (iVar15 = 0; iVar15 + 0xf < iVar13; iVar15 = iVar15 + 0x10) {
        auVar20 = vmulps_avx512f(auVar45,*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [64])ptr = auVar20;
        ptr = (float *)((long)ptr + 0x40);
      }
      for (; iVar15 + 7 < iVar13; iVar15 = iVar15 + 8) {
        auVar45._0_4_ = auVar33._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
        auVar45._4_4_ = auVar33._4_4_ * *(float *)(*(undefined1 (*) [64])ptr + 4);
        auVar45._8_4_ = auVar33._8_4_ * *(float *)(*(undefined1 (*) [64])ptr + 8);
        auVar45._12_4_ = auVar33._12_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        auVar45._16_4_ = auVar33._16_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
        auVar45._20_4_ = auVar33._20_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
        auVar45._28_36_ = auVar20._28_36_;
        auVar45._24_4_ = auVar33._24_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
        auVar20 = ZEXT3264(auVar45._0_32_);
        *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = auVar45._0_32_;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
      }
      for (; iVar15 + 3 < iVar13; iVar15 = iVar15 + 4) {
        fVar30 = *(float *)(*(undefined1 (*) [64])ptr + 4);
        fVar36 = *(float *)(*(undefined1 (*) [64])ptr + 8);
        fVar37 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        *(float *)*(undefined1 (*) [64])ptr = auVar27._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
        *(float *)(*(undefined1 (*) [64])ptr + 4) = auVar27._4_4_ * fVar30;
        *(float *)(*(undefined1 (*) [64])ptr + 8) = auVar27._8_4_ * fVar36;
        *(float *)(*(undefined1 (*) [64])ptr + 0xc) = auVar27._12_4_ * fVar37;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
      }
      for (; iVar15 < iVar13; iVar15 = iVar15 + 1) {
        *(float *)*(undefined1 (*) [64])ptr = auVar26._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 4);
      }
      return;
    }
    bVar12 = false;
    bVar17 = false;
    bVar11 = false;
    auVar33 = ZEXT1628(auVar18);
  }
  else {
    auVar19 = vextractf64x4_avx512f(auVar45,1);
    fVar41 = auVar45._0_4_;
    fVar30 = auVar18._0_4_;
    fVar36 = auVar18._4_4_;
    fVar37 = auVar18._8_4_;
    fVar38 = auVar18._12_4_;
    fVar39 = auVar19._0_4_;
    fVar35 = auVar19._4_4_;
    fVar40 = auVar19._8_4_;
    fVar3 = auVar19._12_4_;
    fVar4 = auVar19._16_4_;
    fVar5 = auVar19._24_4_;
    fVar6 = auVar19._28_4_;
    fVar46 = auVar45._4_4_;
    fVar47 = auVar45._8_4_;
    fVar48 = auVar45._12_4_;
    fVar49 = auVar45._16_4_;
    fVar50 = auVar45._24_4_;
    fVar51 = auVar45._28_4_;
    if (elempack == 1) {
      auVar42._0_4_ = fVar41 + fVar39 + fVar49 + fVar4;
      auVar42._4_4_ = fVar46 + fVar35 + fVar46 + fVar35;
      auVar42._8_4_ = fVar47 + fVar40 + fVar50 + fVar5;
      auVar42._12_4_ = fVar48 + fVar3 + fVar51 + fVar6;
      auVar18 = vshufpd_avx(auVar42,auVar42,1);
      auVar43._0_4_ = auVar18._0_4_ + auVar42._0_4_;
      auVar43._4_4_ = auVar18._4_4_ + auVar42._4_4_;
      auVar43._8_4_ = auVar18._8_4_ + auVar42._8_4_;
      auVar43._12_4_ = auVar18._12_4_ + auVar42._12_4_;
      auVar42 = vmovshdup_avx(auVar43);
      auVar32._0_4_ = fVar30 + 0.0;
      auVar32._4_4_ = fVar36 + 0.0;
      auVar32._8_4_ = fVar37 + 0.0;
      auVar32._12_4_ = fVar38 + 0.0;
      auVar18 = vshufps_avx(auVar27,auVar32,0x11);
      auVar27 = vshufps_avx(auVar27,auVar32,0xbb);
      auVar29._0_4_ = auVar27._0_4_ + auVar18._0_4_;
      auVar29._4_4_ = auVar27._4_4_ + auVar18._4_4_;
      auVar29._8_4_ = auVar27._8_4_ + auVar18._8_4_;
      auVar29._12_4_ = auVar27._12_4_ + auVar18._12_4_;
      auVar18 = vshufpd_avx(auVar29,auVar29,1);
      auVar27._0_4_ = auVar29._0_4_ + auVar18._0_4_;
      auVar27._4_4_ = auVar29._4_4_ + auVar18._4_4_;
      auVar27._8_4_ = auVar29._8_4_ + auVar18._8_4_;
      auVar27._12_4_ = auVar29._12_4_ + auVar18._12_4_;
      auVar18 = vhaddps_avx(auVar27,auVar27);
      auVar18 = ZEXT416((uint)((auVar43._0_4_ + auVar42._0_4_ + auVar26._0_4_ + auVar18._0_4_) /
                               (float)elemcount + eps));
      auVar18 = vsqrtss_avx(auVar18,auVar18);
      auVar20 = ZEXT1664(auVar18);
      auVar26._0_4_ = 1.0 / auVar18._0_4_;
      auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar45 = vbroadcastss_avx512f(auVar26);
      auVar27 = auVar45._0_16_;
      bVar12 = true;
      bVar17 = false;
      bVar11 = false;
      auVar33 = auVar45._0_28_;
    }
    else if (elempack == 4) {
      fVar35 = fVar46 + fVar36 + fVar35;
      auVar28._0_4_ = fVar49 + 0.0 + fVar4 + fVar41 + fVar30 + fVar39 + auVar27._0_4_;
      auVar28._4_4_ = fVar35 + fVar35 + auVar27._4_4_;
      auVar28._8_4_ = fVar50 + 0.0 + fVar5 + fVar47 + fVar37 + fVar40 + auVar27._8_4_;
      auVar28._12_4_ = fVar51 + 0.0 + fVar6 + fVar48 + fVar38 + fVar3 + auVar27._12_4_;
      auVar18._4_4_ = eps;
      auVar18._0_4_ = eps;
      auVar18._8_4_ = eps;
      auVar18._12_4_ = eps;
      auVar20 = ZEXT1664(auVar18);
      auVar31._0_4_ = 1.0 / (float)elemcount;
      auVar31._4_4_ = auVar31._0_4_;
      auVar31._8_4_ = auVar31._0_4_;
      auVar31._12_4_ = auVar31._0_4_;
      auVar18 = vfmadd213ps_fma(auVar31,auVar28,auVar18);
      auVar27 = vrsqrtps_avx(auVar18);
      auVar19._16_16_ = auVar27;
      auVar19._0_16_ = auVar27;
      auVar33 = auVar19._0_28_;
      auVar45 = vshuff64x2_avx512f(ZEXT1664(auVar27),ZEXT1664(auVar27),0);
      bVar11 = true;
      bVar12 = false;
      bVar17 = false;
    }
    else {
      bVar17 = elempack == 8;
      auVar33 = ZEXT1628(auVar18);
      if (bVar17) {
        auVar34._0_4_ = fVar41 + fVar30 + fVar39;
        auVar34._4_4_ = fVar46 + fVar36 + fVar35;
        auVar34._8_4_ = fVar47 + fVar37 + fVar40;
        auVar34._12_4_ = fVar48 + fVar38 + fVar3;
        auVar34._16_4_ = fVar49 + 0.0 + fVar4;
        auVar34._20_4_ = auVar45._20_4_ + 0.0 + auVar19._20_4_;
        auVar34._24_4_ = fVar50 + 0.0 + fVar5;
        auVar34._28_4_ = fVar51 + 0.0 + fVar6;
        auVar23._4_4_ = eps;
        auVar23._0_4_ = eps;
        auVar23._8_4_ = eps;
        auVar23._12_4_ = eps;
        auVar23._16_4_ = eps;
        auVar23._20_4_ = eps;
        auVar23._24_4_ = eps;
        auVar23._28_4_ = eps;
        auVar20 = ZEXT3264(auVar23);
        auVar44._0_4_ = 1.0 / (float)elemcount;
        auVar44._4_4_ = auVar44._0_4_;
        auVar44._8_4_ = auVar44._0_4_;
        auVar44._12_4_ = auVar44._0_4_;
        auVar44._16_4_ = auVar44._0_4_;
        auVar44._20_4_ = auVar44._0_4_;
        auVar44._24_4_ = auVar44._0_4_;
        auVar44._28_4_ = auVar44._0_4_;
        auVar18 = vfmadd213ps_fma(auVar44,auVar34,auVar23);
        auVar19 = vrsqrtps_avx(ZEXT1632(auVar18));
        auVar45 = vinsertf64x4_avx512f(ZEXT3264(auVar19),auVar19,1);
        auVar33 = auVar19._0_28_;
      }
      bVar12 = false;
      bVar11 = false;
    }
    if (gamma_ptr == (float *)0x0) goto LAB_0052ef1c;
    iVar15 = 0;
    if (elempack != 0x10) goto LAB_0052ed8b;
  }
  for (iVar15 = 0; iVar15 + 0xf < iVar13; iVar15 = iVar15 + 0x10) {
    auVar20 = vmulps_avx512f(auVar45,*(undefined1 (*) [64])ptr);
    uVar1 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
    auVar21._4_4_ = uVar1;
    auVar21._0_4_ = uVar1;
    auVar21._8_4_ = uVar1;
    auVar21._12_4_ = uVar1;
    auVar21._16_4_ = uVar1;
    auVar21._20_4_ = uVar1;
    auVar21._24_4_ = uVar1;
    auVar21._28_4_ = uVar1;
    auVar21._32_4_ = uVar1;
    auVar21._36_4_ = uVar1;
    auVar21._40_4_ = uVar1;
    auVar21._44_4_ = uVar1;
    auVar21._48_4_ = uVar1;
    auVar21._52_4_ = uVar1;
    auVar21._56_4_ = uVar1;
    auVar21._60_4_ = uVar1;
    auVar20 = vmulps_avx512f(auVar20,auVar21);
    *(undefined1 (*) [64])ptr = auVar20;
    ptr = (float *)((long)ptr + 0x40);
    gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 4);
  }
LAB_0052ed8b:
  fVar30 = auVar33._0_4_;
  fVar36 = auVar33._4_4_;
  fVar37 = auVar33._8_4_;
  fVar38 = auVar33._12_4_;
  fVar39 = auVar33._16_4_;
  fVar35 = auVar33._20_4_;
  fVar40 = auVar33._24_4_;
  if (bVar17) {
    for (; iVar15 + 0xf < iVar13; iVar15 = iVar15 + 0x10) {
      uVar1 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
      uVar2 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 4);
      auVar52._4_4_ = uVar2;
      auVar52._0_4_ = uVar2;
      auVar52._8_4_ = uVar2;
      auVar52._12_4_ = uVar2;
      auVar52._16_4_ = uVar2;
      auVar52._20_4_ = uVar2;
      auVar52._24_4_ = uVar2;
      auVar52._28_4_ = uVar2;
      auVar20 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,
                                                  CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,
                                                  uVar1)))))))),auVar52,1);
      auVar21 = vmulps_avx512f(auVar45,*(undefined1 (*) [64])ptr);
      auVar20 = vmulps_avx512f(auVar21,auVar20);
      *(undefined1 (*) [64])ptr = auVar20;
      ptr = (float *)((long)ptr + 0x40);
      gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 8);
    }
    for (; iVar15 + 7 < iVar13; iVar15 = iVar15 + 8) {
      auVar25._0_4_ = fVar30 * *(float *)*(undefined1 (*) [64])ptr;
      auVar25._4_4_ = fVar36 * *(float *)(*(undefined1 (*) [64])ptr + 4);
      auVar25._8_4_ = fVar37 * *(float *)(*(undefined1 (*) [64])ptr + 8);
      auVar25._12_4_ = fVar38 * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
      auVar25._16_4_ = fVar39 * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
      auVar25._20_4_ = fVar35 * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
      auVar25._28_36_ = auVar20._28_36_;
      auVar25._24_4_ = fVar40 * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
      uVar1 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
      auVar8._4_4_ = uVar1;
      auVar8._0_4_ = uVar1;
      auVar8._8_4_ = uVar1;
      auVar8._12_4_ = uVar1;
      auVar8._16_4_ = uVar1;
      auVar8._20_4_ = uVar1;
      auVar8._24_4_ = uVar1;
      auVar8._28_4_ = uVar1;
      auVar19 = vmulps_avx512vl(auVar25._0_32_,auVar8);
      auVar20 = ZEXT3264(auVar19);
      *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = auVar19;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
      gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 4);
    }
  }
  if (bVar11) {
    for (; iVar15 + 0xf < iVar13; iVar15 = iVar15 + 0x10) {
      uVar1 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 8);
      auVar24._4_4_ = uVar1;
      auVar24._0_4_ = uVar1;
      auVar24._8_4_ = uVar1;
      auVar24._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 0xc);
      auVar24._20_4_ = uVar1;
      auVar24._16_4_ = uVar1;
      auVar24._24_4_ = uVar1;
      auVar24._28_4_ = uVar1;
      uVar1 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
      uVar2 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 4);
      auVar20 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT1616(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))
                                                        ),
                                               CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))
                                                        ))),auVar24,1);
      auVar21 = vmulps_avx512f(auVar45,*(undefined1 (*) [64])ptr);
      auVar20 = vmulps_avx512f(auVar21,auVar20);
      *(undefined1 (*) [64])ptr = auVar20;
      ptr = (float *)((long)ptr + 0x40);
      gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 0x10);
    }
    for (; iVar15 + 7 < iVar13; iVar15 = iVar15 + 8) {
      fVar3 = *(float *)*(undefined1 (*) [64])gamma_ptr;
      fVar4 = *(float *)(*(undefined1 (*) [64])gamma_ptr + 4);
      auVar9._4_4_ = fVar36 * *(float *)(*(undefined1 (*) [64])ptr + 4) * fVar3;
      auVar9._0_4_ = fVar30 * *(float *)*(undefined1 (*) [64])ptr * fVar3;
      auVar9._8_4_ = fVar37 * *(float *)(*(undefined1 (*) [64])ptr + 8) * fVar3;
      auVar9._12_4_ = fVar38 * *(float *)(*(undefined1 (*) [64])ptr + 0xc) * fVar3;
      auVar9._16_4_ = fVar39 * *(float *)(*(undefined1 (*) [64])ptr + 0x10) * fVar4;
      auVar9._20_4_ = fVar35 * *(float *)(*(undefined1 (*) [64])ptr + 0x14) * fVar4;
      auVar9._24_4_ = fVar40 * *(float *)(*(undefined1 (*) [64])ptr + 0x18) * fVar4;
      auVar9._28_4_ = fVar4;
      auVar20 = ZEXT3264(auVar9);
      *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = auVar9;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
      gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 8);
    }
    for (; iVar15 + 3 < iVar13; iVar15 = iVar15 + 4) {
      auVar22._0_4_ = auVar27._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
      auVar22._4_4_ = auVar27._4_4_ * *(float *)(*(undefined1 (*) [64])ptr + 4);
      auVar22._8_4_ = auVar27._8_4_ * *(float *)(*(undefined1 (*) [64])ptr + 8);
      auVar22._12_4_ = auVar27._12_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
      uVar1 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
      auVar7._4_4_ = uVar1;
      auVar7._0_4_ = uVar1;
      auVar7._8_4_ = uVar1;
      auVar7._12_4_ = uVar1;
      auVar18 = vmulps_avx512vl(auVar22,auVar7);
      auVar20 = ZEXT1664(auVar18);
      *(undefined1 (*) [16])*(undefined1 (*) [64])ptr = auVar18;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
      gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 4);
    }
  }
  if (bVar12) {
    for (; iVar15 + 0xf < iVar13; iVar15 = iVar15 + 0x10) {
      auVar20 = vmulps_avx512f(auVar45,*(undefined1 (*) [64])ptr);
      auVar20 = vmulps_avx512f(auVar20,*(undefined1 (*) [64])gamma_ptr);
      *(undefined1 (*) [64])ptr = auVar20;
      ptr = (float *)((long)ptr + 0x40);
      gamma_ptr = (float *)((long)gamma_ptr + 0x40);
    }
    for (; iVar15 + 7 < iVar13; iVar15 = iVar15 + 8) {
      auVar10._4_4_ =
           fVar36 * *(float *)(*(undefined1 (*) [64])ptr + 4) *
           *(float *)(*(undefined1 (*) [64])gamma_ptr + 4);
      auVar10._0_4_ =
           fVar30 * *(float *)*(undefined1 (*) [64])ptr * *(float *)*(undefined1 (*) [64])gamma_ptr;
      auVar10._8_4_ =
           fVar37 * *(float *)(*(undefined1 (*) [64])ptr + 8) *
           *(float *)(*(undefined1 (*) [64])gamma_ptr + 8);
      auVar10._12_4_ =
           fVar38 * *(float *)(*(undefined1 (*) [64])ptr + 0xc) *
           *(float *)(*(undefined1 (*) [64])gamma_ptr + 0xc);
      auVar10._16_4_ =
           fVar39 * *(float *)(*(undefined1 (*) [64])ptr + 0x10) *
           *(float *)(*(undefined1 (*) [64])gamma_ptr + 0x10);
      auVar10._20_4_ =
           fVar35 * *(float *)(*(undefined1 (*) [64])ptr + 0x14) *
           *(float *)(*(undefined1 (*) [64])gamma_ptr + 0x14);
      auVar10._24_4_ =
           fVar40 * *(float *)(*(undefined1 (*) [64])ptr + 0x18) *
           *(float *)(*(undefined1 (*) [64])gamma_ptr + 0x18);
      auVar10._28_4_ = auVar20._28_4_;
      auVar20 = ZEXT3264(auVar10);
      *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = auVar10;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
      gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 0x20);
    }
    for (; iVar15 + 3 < iVar13; iVar15 = iVar15 + 4) {
      fVar30 = *(float *)(*(undefined1 (*) [64])ptr + 4);
      fVar36 = *(float *)(*(undefined1 (*) [64])ptr + 8);
      fVar37 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
      fVar38 = *(float *)(*(undefined1 (*) [64])gamma_ptr + 4);
      fVar39 = *(float *)(*(undefined1 (*) [64])gamma_ptr + 8);
      fVar35 = *(float *)(*(undefined1 (*) [64])gamma_ptr + 0xc);
      *(float *)*(undefined1 (*) [64])ptr =
           auVar27._0_4_ * *(float *)*(undefined1 (*) [64])ptr *
           *(float *)*(undefined1 (*) [64])gamma_ptr;
      *(float *)(*(undefined1 (*) [64])ptr + 4) = auVar27._4_4_ * fVar30 * fVar38;
      *(float *)(*(undefined1 (*) [64])ptr + 8) = auVar27._8_4_ * fVar36 * fVar39;
      *(float *)(*(undefined1 (*) [64])ptr + 0xc) = auVar27._12_4_ * fVar37 * fVar35;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
      gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 0x10);
    }
  }
  for (lVar14 = 0; iVar15 + (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
    *(float *)(*(undefined1 (*) [64])ptr + lVar14 * 4) =
         auVar26._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + lVar14 * 4) *
         *(float *)(*(undefined1 (*) [64])gamma_ptr + lVar14 * 4);
  }
  return;
}

Assistant:

static void rmsnorm(float* ptr, const float* gamma_ptr, float eps, int elemcount, int elempack)
{
    const int size = elemcount * elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _rms_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _rms_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _rms = _mm_set1_ps(0.f);
#endif // __SSE2__
    float rms = 0.f;
    {
        const float* ptr0 = ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr0);
            _rms_avx512 = _mm512_fmadd_ps(_p, _p, _rms_avx512);
            ptr0 += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr0);
            _rms_avx = _mm256_comp_fmadd_ps(_p, _p, _rms_avx);
            ptr0 += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _rms = _mm_comp_fmadd_ps(_p, _p, _rms);
            ptr0 += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            rms += ptr0[0] * ptr0[0];
            ptr0++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512 _elemcount = _mm512_set1_ps((float)elemcount);
        __m512 _eps = _mm512_set1_ps(eps);

        _rms_avx512 = _mm512_div_ps(_rms_avx512, _elemcount);
        _rms_avx512 = _mm512_add_ps(_rms_avx512, _eps);

        __m256 _rms0 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_rms_avx512, 0));
        __m256 _rms1 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_rms_avx512, 1));
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms0), _rms1, 1);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _rms0 = _mm512_castps512_ps256(_rms_avx512);
            __m256 _rms1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_rms_avx512), 1));
            _rms_avx = _mm256_add_ps(_rms_avx, _rms0);
            _rms_avx = _mm256_add_ps(_rms_avx, _rms1);
        }
#endif // __AVX512F__

        __m256 _elemcount = _mm256_set1_ps((float)elemcount);
        __m256 _eps = _mm256_set1_ps(eps);

        _rms_avx = _mm256_div_ps(_rms_avx, _elemcount);
        _rms_avx = _mm256_add_ps(_rms_avx, _eps);

        _rms_avx = _mm256_rsqrt_ps(_rms_avx);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _rms0 = _mm512_castps512_ps256(_rms_avx512);
            __m256 _rms1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_rms_avx512), 1));
            _rms_avx = _mm256_add_ps(_rms_avx, _rms0);
            _rms_avx = _mm256_add_ps(_rms_avx, _rms1);
        }
#endif // __AVX512F__
        {
            __m128 _rms0 = _mm256_castps256_ps128(_rms_avx);
            __m128 _rms1 = _mm256_extractf128_ps(_rms_avx, 1);
            _rms = _mm_add_ps(_rms, _rms0);
            _rms = _mm_add_ps(_rms, _rms1);
        }
#endif // __AVX__

        __m128 _elemcount = _mm_set1_ps((float)elemcount);
        __m128 _eps = _mm_set1_ps(eps);

        _rms = _mm_div_ps(_rms, _elemcount);
        _rms = _mm_add_ps(_rms, _eps);

        _rms = _mm_rsqrt_ps(_rms);
#if __AVX__
        _rms_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_rms), _rms, 1);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        rms += _mm512_comp_reduce_add_ps(_rms_avx512);
#endif // __AVX512F__
        rms += _mm256_reduce_add_ps(_rms_avx);
#endif // __AVX__
        rms += _mm_reduce_add_ps(_rms);
#endif // __SSE2__

        rms = 1.f / sqrtf(rms / elemcount + eps);
#if __SSE2__
        _rms = _mm_set1_ps(rms);
#if __AVX__
        _rms_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_rms), _rms, 1);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

    if (gamma_ptr)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_set1_ps(gamma_ptr[0]);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 1;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m256 _gamma0 = _mm256_set1_ps(gamma_ptr[0]);
                __m256 _gamma1 = _mm256_set1_ps(gamma_ptr[1]);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma0), _gamma1, 1);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 2;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_set1_ps(gamma_ptr[0]);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 1;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m128 _gamma2 = _mm_set1_ps(gamma_ptr[2]);
                __m128 _gamma3 = _mm_set1_ps(gamma_ptr[3]);
                __m256 _gamma01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                __m256 _gamma23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma2), _gamma3, 1);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma01), _gamma23, 1);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 4;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m256 _gamma = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 2;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_set1_ps(gamma_ptr[0]);
                _p = _mm_mul_ps(_p, _rms);
                _p = _mm_mul_ps(_p, _gamma);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 1;
            }
        }
        if (elempack == 1)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_loadu_ps(gamma_ptr);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_loadu_ps(gamma_ptr);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_loadu_ps(gamma_ptr);
                _p = _mm_mul_ps(_p, _rms);
                _p = _mm_mul_ps(_p, _gamma);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 4;
            }
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = (ptr[0] * rms) * gamma_ptr[0];
            ptr++;
            gamma_ptr++;
        }
    }
    else
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_mul_ps(_p, _rms_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_mul_ps(_p, _rms_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_mul_ps(_p, _rms);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = ptr[0] * rms;
            ptr++;
        }
    }
}